

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

QString * __thiscall QTextBrowserPrivate::findFile(QTextBrowserPrivate *this,QUrl *name)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  add_const_t<const_QList<QString>_> *__range1;
  QString *path;
  const_iterator __end1;
  const_iterator __begin1;
  QString fileName;
  undefined4 in_stack_fffffffffffffe58;
  ComponentFormattingOption in_stack_fffffffffffffe5c;
  undefined6 in_stack_fffffffffffffe60;
  byte in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  QLatin1String *in_stack_fffffffffffffe68;
  QFileInfo local_138 [12];
  QChar local_12c;
  QChar local_12a;
  QString *local_128;
  const_iterator local_120;
  const_iterator local_118;
  QFileInfo local_110 [40];
  undefined1 local_e8 [56];
  undefined1 local_b0 [24];
  QLatin1StringView local_98;
  QLatin1StringView local_48;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x6dc45c);
  QUrl::scheme();
  local_48 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffe68,
                        CONCAT17(in_stack_fffffffffffffe67,
                                 CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
  bVar1 = ::operator==((QString *)in_stack_fffffffffffffe68,
                       (QLatin1StringView *)
                       CONCAT17(in_stack_fffffffffffffe67,
                                CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
  QString::~QString((QString *)0x6dc4b5);
  if (bVar1) {
    local_98 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffe68,
                          CONCAT17(in_stack_fffffffffffffe67,
                                   CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)
               CONCAT17(in_stack_fffffffffffffe67,
                        CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
               in_stack_fffffffffffffe5c);
    QUrl::path((QFlags_conflict1 *)local_b0);
    ::operator+(in_stack_fffffffffffffe68,
                (QString *)
                CONCAT17(in_stack_fffffffffffffe67,
                         CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QLatin1String,_QString> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    QString::operator=((QString *)
                       CONCAT17(in_stack_fffffffffffffe67,
                                CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
                       (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    QString::~QString((QString *)0x6dc56c);
    QStringBuilder<QLatin1String,_QString>::~QStringBuilder
              ((QStringBuilder<QLatin1String,_QString> *)0x6dc579);
    QString::~QString((QString *)0x6dc586);
  }
  else {
    QUrl::scheme();
    bVar1 = QString::isEmpty((QString *)0x6dc5aa);
    QString::~QString((QString *)0x6dc5bb);
    if (bVar1) {
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
                 in_stack_fffffffffffffe5c);
      QUrl::path((QFlags_conflict1 *)local_e8);
      QString::operator=((QString *)
                         CONCAT17(in_stack_fffffffffffffe67,
                                  CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
                         (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      QString::~QString((QString *)0x6dc61c);
    }
    else {
      QUrl::toLocalFile();
      QString::operator=((QString *)
                         CONCAT17(in_stack_fffffffffffffe67,
                                  CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
                         (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      QString::~QString((QString *)0x6dc652);
    }
  }
  bVar1 = QString::isEmpty((QString *)0x6dc661);
  if (bVar1) {
    QString::QString((QString *)
                     CONCAT17(in_stack_fffffffffffffe67,
                              CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
                     (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  else {
    QFileInfo::QFileInfo(local_110,(QString *)&local_20);
    bVar2 = QFileInfo::isAbsolute((QFileInfo *)0x6dc6a8);
    QFileInfo::~QFileInfo(local_110);
    if ((bVar2 & 1) == 0) {
      local_118.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_118 = QList<QString>::begin
                            ((QList<QString> *)
                             CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffe66,
                                                     in_stack_fffffffffffffe60)));
      local_120.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_120 = QList<QString>::end((QList<QString> *)
                                      CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffe66,
                                                              in_stack_fffffffffffffe60)));
      while( true ) {
        local_128 = local_120.i;
        bVar1 = QList<QString>::const_iterator::operator!=(&local_118,local_120);
        if (!bVar1) break;
        (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QList<QString>::const_iterator::operator*(&local_118);
        QString::QString((QString *)
                         CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60
                                                )),
                         (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        QChar::QChar<char16_t,_true>(&local_12a,L'/');
        uVar3 = QString::endsWith((QChar *)in_RDI,(uint)(ushort)local_12a.ucs);
        if ((uVar3 & 1) == 0) {
          QChar::QChar<char16_t,_true>(&local_12c,L'/');
          QString::append((QChar *)in_RDI);
        }
        QString::append((QString *)in_RDI);
        QFileInfo::QFileInfo(local_138,(QString *)in_RDI);
        in_stack_fffffffffffffe66 = QFileInfo::isReadable();
        QFileInfo::~QFileInfo(local_138);
        if ((in_stack_fffffffffffffe66 & 1) != 0) goto LAB_006dc89d;
        QString::~QString((QString *)0x6dc865);
        QList<QString>::const_iterator::operator++(&local_118);
      }
      QString::QString((QString *)
                       CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60))
                       ,(QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    else {
      QString::QString((QString *)
                       CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60))
                       ,(QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
  }
LAB_006dc89d:
  QString::~QString((QString *)0x6dc8aa);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextBrowserPrivate::findFile(const QUrl &name) const
{
    QString fileName;
    if (name.scheme() == "qrc"_L1) {
        fileName = ":/"_L1 + name.path();
    } else if (name.scheme().isEmpty()) {
        fileName = name.path();
    } else {
#if defined(Q_OS_ANDROID)
        if (name.scheme() == "assets"_L1)
            fileName = "assets:"_L1 + name.path();
        else
#endif
            fileName = name.toLocalFile();
    }

    if (fileName.isEmpty())
        return fileName;

    if (QFileInfo(fileName).isAbsolute())
        return fileName;

    for (QString path : std::as_const(searchPaths)) {
        if (!path.endsWith(u'/'))
            path.append(u'/');
        path.append(fileName);
        if (QFileInfo(path).isReadable())
            return path;
    }

    return fileName;
}